

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_blas3.c
# Opt level: O1

int sp_cgemm(char *transa,char *transb,int m,int n,int k,singlecomplex alpha,SuperMatrix *A,
            singlecomplex *b,int ldb,singlecomplex beta,singlecomplex *c,int ldc)

{
  ulong uVar1;
  
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
    do {
      sp_cgemv(transa,alpha,A,b,1,beta,c,1);
      c = c + ldc;
      b = b + ldb;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return 0;
}

Assistant:

int
sp_cgemm(char *transa, char *transb, int m, int n, int k, 
         singlecomplex alpha, SuperMatrix *A, singlecomplex *b, int ldb, 
         singlecomplex beta, singlecomplex *c, int ldc)
{
    int    incx = 1, incy = 1;
    int    j;

    for (j = 0; j < n; ++j) {
	sp_cgemv(transa, alpha, A, &b[ldb*j], incx, beta, &c[ldc*j], incy);
    }
    return 0;    
}